

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

void basist::basisu_transcoder::write_opaque_alpha_blocks
               (uint32_t num_blocks_x,uint32_t num_blocks_y,void *pOutput_blocks,block_format fmt,
               uint32_t block_stride_in_bytes,uint32_t output_row_pitch_in_blocks_or_pixels)

{
  uint32_t y;
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  bool bVar5;
  
  if (output_row_pitch_in_blocks_or_pixels == 0) {
    output_row_pitch_in_blocks_or_pixels = num_blocks_x;
  }
  if (fmt == cBC4) {
    for (uVar1 = 0; uVar1 != num_blocks_y; uVar1 = uVar1 + 1) {
      uVar2 = output_row_pitch_in_blocks_or_pixels * block_stride_in_bytes * uVar1;
      uVar3 = num_blocks_x;
      while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
        uVar4 = (ulong)uVar2;
        *(undefined2 *)((long)pOutput_blocks + uVar4) = 0xffff;
        *(undefined4 *)((long)pOutput_blocks + uVar4 + 2) = 0;
        *(undefined2 *)((long)pOutput_blocks + uVar4 + 6) = 0;
        uVar2 = uVar2 + block_stride_in_bytes;
      }
    }
  }
  else if ((fmt == cETC2_EAC_R11) || (fmt == cETC2_EAC_A8)) {
    for (uVar1 = 0; uVar1 != num_blocks_y; uVar1 = uVar1 + 1) {
      uVar2 = output_row_pitch_in_blocks_or_pixels * block_stride_in_bytes * uVar1;
      uVar3 = num_blocks_x;
      while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
        uVar4 = (ulong)uVar2;
        *(undefined2 *)((long)pOutput_blocks + uVar4) = 0x1dff;
        *(undefined4 *)((long)pOutput_blocks + uVar4 + 2) = 0x92244992;
        *(undefined2 *)((long)pOutput_blocks + uVar4 + 6) = 0x2449;
        uVar2 = uVar2 + block_stride_in_bytes;
      }
    }
  }
  return;
}

Assistant:

void basisu_transcoder::write_opaque_alpha_blocks(
		uint32_t num_blocks_x, uint32_t num_blocks_y,
		void* pOutput_blocks, block_format fmt,
		uint32_t block_stride_in_bytes, uint32_t output_row_pitch_in_blocks_or_pixels)
	{
		// 'num_blocks_y', 'pOutput_blocks' & 'block_stride_in_bytes' unused
		// when disabling BASISD_SUPPORT_ETC2_EAC_A8 *and* BASISD_SUPPORT_DXT5A
		BASISU_NOTE_UNUSED(num_blocks_y);
		BASISU_NOTE_UNUSED(pOutput_blocks);
		BASISU_NOTE_UNUSED(block_stride_in_bytes);

		if (!output_row_pitch_in_blocks_or_pixels)
			output_row_pitch_in_blocks_or_pixels = num_blocks_x;
				
		if ((fmt == block_format::cETC2_EAC_A8) || (fmt == block_format::cETC2_EAC_R11))
		{
#if BASISD_SUPPORT_ETC2_EAC_A8
			eac_block blk;
			blk.m_base = 255;
			blk.m_multiplier = 1;
			blk.m_table = 13;

			// Selectors are all 4's
			memcpy(&blk.m_selectors, g_etc2_eac_a8_sel4, sizeof(g_etc2_eac_a8_sel4));

			for (uint32_t y = 0; y < num_blocks_y; y++)
			{
				uint32_t dst_ofs = y * output_row_pitch_in_blocks_or_pixels * block_stride_in_bytes;
				for (uint32_t x = 0; x < num_blocks_x; x++)
				{
					memcpy((uint8_t*)pOutput_blocks + dst_ofs, &blk, sizeof(blk));
					dst_ofs += block_stride_in_bytes;
				}
			}
#endif
		}
		else if (fmt == block_format::cBC4)
		{
#if BASISD_SUPPORT_DXT5A
			dxt5a_block blk;
			blk.m_endpoints[0] = 255;
			blk.m_endpoints[1] = 255;
			memset(blk.m_selectors, 0, sizeof(blk.m_selectors));

			for (uint32_t y = 0; y < num_blocks_y; y++)
			{
				uint32_t dst_ofs = y * output_row_pitch_in_blocks_or_pixels * block_stride_in_bytes;
				for (uint32_t x = 0; x < num_blocks_x; x++)
				{
					memcpy((uint8_t*)pOutput_blocks + dst_ofs, &blk, sizeof(blk));
					dst_ofs += block_stride_in_bytes;
				}
			}
#endif
		}
	}